

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

ChArchiveIn * __thiscall
chrono::ChArchiveIn::operator>>(ChArchiveIn *this,ChNameValue<double> *bVal)

{
  char *local_28;
  double *pdStack_20;
  char local_18;
  
  local_28 = bVal->_name;
  pdStack_20 = bVal->_value;
  local_18 = bVal->_flags;
  (*(this->super_ChArchive)._vptr_ChArchive[4])(this,&local_28);
  return this;
}

Assistant:

ChArchiveIn& operator>>(ChNameValue<T> bVal) {
          this->in(bVal);
          return (*this);
      }